

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O3

int __thiscall
helics::NetworkCommsInterface::findOpenPort(NetworkCommsInterface *this,int count,string_view host)

{
  int iVar1;
  int iVar2;
  string_view host_00;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if ((this->openPorts).startingPort < 0) {
    iVar2 = (this->PortNumber).super___atomic_base<int>._M_i;
    iVar1 = (*(this->super_CommsInterface)._vptr_CommsInterface[10])();
    iVar2 = iVar2 - iVar1;
    if (iVar2 < count * 10 && -1 < iVar2) {
      iVar1 = (*(this->super_CommsInterface)._vptr_CommsInterface[10])(this);
      iVar2 = (iVar2 + 1) * count * 10;
    }
    else {
      iVar1 = (this->PortNumber).super___atomic_base<int>._M_i;
      iVar2 = count * 5;
    }
    (this->openPorts).startingPort = iVar2 + iVar1;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,host._M_str,host._M_str + host._M_len);
  host_00._M_str = (char *)local_50;
  host_00._M_len = local_48;
  iVar2 = PortAllocator::findOpenPort(&this->openPorts,count,host_00);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return iVar2;
}

Assistant:

int NetworkCommsInterface::findOpenPort(int count, std::string_view host)
{
    if (openPorts.getDefaultStartingPort() < 0) {
        auto dport = PortNumber - getDefaultBrokerPort();
        auto start = (dport < 10 * count && dport >= 0) ?
            getDefaultBrokerPort() + 10 * count * (dport + 1) :
            PortNumber + 5 * count;
        openPorts.setStartingPortNumber(start);
    }
    return openPorts.findOpenPort(count, std::string(host));
}